

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O2

void __thiscall ConfigTest_reload_Test::TestBody(ConfigTest_reload_Test *this)

{
  pointer *__ptr;
  char *pcVar1;
  undefined1 local_208 [64];
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_1c8;
  AssertionResult gtest_ar;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_198;
  path local_178;
  path local_150;
  path file_path;
  path local_100;
  config l_config;
  
  jessilib::config::config(&l_config);
  std::filesystem::__cxx11::path::path<char[12],std::filesystem::__cxx11::path>
            (&local_150,(char (*) [12])"reload.test",auto_format);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_208,"some_data",(allocator<char> *)&local_1c8);
  make_tmp_file(&file_path,&local_150,(string *)local_208);
  std::__cxx11::string::~string((string *)local_208);
  std::filesystem::__cxx11::path::~path(&local_150);
  local_208._0_8_ = local_208 + 0x10;
  local_208._8_8_ = 0;
  local_208[0x10] = '\0';
  jessilib::config::load((path *)&l_config,(string *)&file_path,(text_encoding)local_208);
  std::__cxx11::string::~string((string *)local_208);
  std::filesystem::__cxx11::path::path<char[12],std::filesystem::__cxx11::path>
            (&local_178,(char (*) [12])"reload.test",auto_format);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_208,"some_other_data",(allocator<char> *)&local_1c8);
  make_tmp_file(&local_100,&local_178,(string *)local_208);
  std::filesystem::__cxx11::path::~path(&local_100);
  std::__cxx11::string::~string((string *)local_208);
  std::filesystem::__cxx11::path::~path(&local_178);
  jessilib::config::reload();
  jessilib::config::data();
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  local_198._M_string_length = 0;
  local_198.field_2._M_local_buf[0] = '\0';
  jessilib::object::
  get<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_nullptr>
            (&local_1c8,(object *)local_208,&local_198);
  testing::internal::CmpHelperEQ<std::__cxx11::u8string,char8_t[16]>
            ((internal *)&gtest_ar,"l_config.data().get<std::u8string>()","u8\"some_other_data\"",
             &local_1c8,(char8_t (*) [16])"some_other_data");
  std::__cxx11::u8string::~u8string((u8string *)&local_1c8);
  std::__cxx11::u8string::~u8string((u8string *)&local_198);
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       *)local_208);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_208);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/config.cpp"
               ,0x61,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1c8,(Message *)local_208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1c8);
    if ((void *)local_208._0_8_ != (void *)0x0) {
      (**(code **)(*(long *)local_208._0_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::filesystem::__cxx11::path::~path(&file_path);
  jessilib::config::~config(&l_config);
  return;
}

Assistant:

TEST(ConfigTest, reload) {
	config l_config;

	// Write temp file out
	std::filesystem::path file_path = make_tmp_file("reload.test", "some_data");

	// Load data from disk
	l_config.load(file_path);

	// Write new data to disk
	make_tmp_file("reload.test", "some_other_data");

	// Reload data from disk and compare
	l_config.reload();
	EXPECT_EQ(l_config.data().get<std::u8string>(), u8"some_other_data");
}